

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Expression * __thiscall
wasm::IRBuilder::fixExtraOutput(IRBuilder *this,ScopeCtx *scope,Name label,Expression *curr)

{
  Builder *this_00;
  Index index;
  char *pcVar1;
  string_view skipLabel;
  undefined4 index_00;
  Type TVar2;
  _Storage<wasm::Type,_true> _Var3;
  Block *pBVar4;
  size_t sVar5;
  size_t sVar6;
  TupleMake *right;
  Expression *pEVar7;
  TupleExtract *pTVar8;
  pointer pNVar9;
  Type receivedType_00;
  pointer pNVar10;
  ulong uVar11;
  Index j;
  ulong uVar12;
  Iterator __first;
  Name trampolineLabel;
  Name trampolineLabel_00;
  string_view sVar13;
  Iterator __last;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 auStack_d8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  undefined1 local_b0 [8];
  anon_class_16_2_3efcb345 addTrampoline;
  size_t local_98;
  _Storage<wasm::Type,_true> local_90;
  Type labelType;
  _Storage<wasm::Type,_true> local_58;
  Type extraType;
  Type receivedType;
  Block *local_40;
  Expression *curr_local;
  
  local_b0 = (undefined1  [8])&local_40;
  addTrampoline.curr = (Expression **)this;
  local_40 = (Block *)curr;
  if ((*(__index_type *)
        ((long)&(scope->scope).
                super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
        + 0x18) == '\x05') &&
     (*(long *)&(scope->scope).
                super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      != 0)) {
    local_90 = (_Storage<wasm::Type,_true>)(scope->inputType).id;
  }
  else {
    local_90._M_value = ScopeCtx::getResultType(scope);
  }
  pNVar9 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
           .super__Vector_impl_data._M_start;
  pNVar10 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pNVar10 != pNVar9) {
    this_00 = &this->builder;
    uVar11 = 0;
    local_98 = 0;
    labelType.id = 0;
    do {
      pcVar1 = pNVar9[uVar11].super_IString.str._M_str;
      if (pcVar1 != (char *)0x0) {
        addTrampoline.this = (IRBuilder *)pNVar9[uVar11].super_IString.str._M_len;
        index = (scope->outputLocals).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        local_58._M_value = Function::getLocalType(this->func,index);
        sVar5 = wasm::Type::size(&local_58._M_value);
        sVar6 = wasm::Type::size(&local_90._M_value);
        __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar5;
        __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)&local_90;
        __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar6;
        __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)&local_90;
        std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_d8,__first,__last,
                   (allocator_type *)&curr_local);
        wasm::Type::Type(&extraType,(Tuple *)auStack_d8);
        if (auStack_d8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_d8,
                          (long)elems.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_d8);
        }
        sVar13._M_str = (char *)labelType.id;
        sVar13._M_len = local_98;
        skipLabel = (string_view)label.super_IString.str;
        if (((*(__index_type *)
               ((long)&(scope->scope).
                       super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
               + 0x18) == '\x05') &&
            (*(long *)&(scope->scope).
                       super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                       .
                       super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             != 0)) && (labelType.id == 0)) {
          sVar13 = (string_view)makeFresh(this,label,0);
          skipLabel = sVar13;
        }
        labelType.id = (uintptr_t)sVar13._M_str;
        local_98 = sVar13._M_len;
        trampolineLabel.super_IString.str._M_str = pcVar1;
        trampolineLabel.super_IString.str._M_len = (size_t)addTrampoline.this;
        fixExtraOutput::anon_class_16_2_3efcb345::operator()
                  ((anon_class_16_2_3efcb345 *)local_b0,extraType,trampolineLabel,(Name)skipLabel);
        pBVar4 = local_40;
        _Var3 = local_58;
        if (extraType.id == 0) {
          if (local_58 != local_90) {
            __assert_fail("extraType == labelType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                          ,0x4be,
                          "Expression *wasm::IRBuilder::fixExtraOutput(ScopeCtx &, Name, Expression *)"
                         );
          }
          pEVar7 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
          pEVar7->_id = LocalGetId;
          *(Index *)(pEVar7 + 1) = index;
          (pEVar7->type).id = (uintptr_t)_Var3;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_58;
          local_40 = Builder::makeSequence(this_00,(Expression *)pBVar4,pEVar7,type_00);
        }
        else {
          addScratchLocal((Result<unsigned_int> *)auStack_d8,this,extraType);
          index_00 = auStack_d8._0_4_;
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_d8);
          local_40 = (Block *)Builder::makeLocalSet(this_00,index_00,(Expression *)local_40);
          _Var3 = local_58;
          auStack_d8 = (undefined1  [8])0x0;
          elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (((ulong)local_58 < 2) || ((6 < (ulong)local_58 & local_58._0_1_) != 0)) {
            uVar12 = 0;
            while( true ) {
              sVar5 = wasm::Type::size(&local_58._M_value);
              _Var3 = local_58;
              if (sVar5 <= uVar12) break;
              pEVar7 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
              pEVar7->_id = LocalGetId;
              *(Index *)(pEVar7 + 1) = index;
              (pEVar7->type).id = (uintptr_t)_Var3;
              pTVar8 = (TupleExtract *)MixedArena::allocSpace(&this_00->wasm->allocator,0x20,8);
              (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
                   TupleExtractId;
              (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id
                   = 0;
              pTVar8->tuple = pEVar7;
              pTVar8->index = (Index)uVar12;
              TupleExtract::finalize(pTVar8);
              curr_local = (Expression *)pTVar8;
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                         &curr_local);
              uVar12 = (ulong)((Index)uVar12 + 1);
            }
          }
          else {
            curr_local = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
            curr_local->_id = LocalGetId;
            *(Index *)(curr_local + 1) = index;
            (curr_local->type).id = (uintptr_t)_Var3;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                       &curr_local);
          }
          TVar2.id = extraType.id;
          if ((extraType.id < 2) || ((6 < extraType.id & (byte)extraType.id) != 0)) {
            uVar12 = 0;
            while( true ) {
              sVar5 = wasm::Type::size(&extraType);
              TVar2 = extraType;
              if (sVar5 <= uVar12) break;
              pEVar7 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
              pEVar7->_id = LocalGetId;
              *(undefined4 *)(pEVar7 + 1) = index_00;
              (pEVar7->type).id = TVar2.id;
              pTVar8 = (TupleExtract *)MixedArena::allocSpace(&this_00->wasm->allocator,0x20,8);
              (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
                   TupleExtractId;
              (pTVar8->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id
                   = 0;
              pTVar8->tuple = pEVar7;
              pTVar8->index = (Index)uVar12;
              TupleExtract::finalize(pTVar8);
              curr_local = (Expression *)pTVar8;
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                         &curr_local);
              uVar12 = (ulong)((Index)uVar12 + 1);
            }
          }
          else {
            curr_local = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
            curr_local->_id = LocalGetId;
            *(undefined4 *)(curr_local + 1) = index_00;
            (curr_local->type).id = TVar2.id;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_d8,
                       &curr_local);
          }
          pBVar4 = local_40;
          right = Builder::
                  makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                            (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)auStack_d8);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = local_90;
          local_40 = Builder::makeSequence(this_00,(Expression *)pBVar4,(Expression *)right,type);
          if (auStack_d8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_d8,
                            (long)elems.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_d8);
          }
        }
        pNVar9 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pNVar10 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      TVar2.id = labelType.id;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < (ulong)((long)pNVar10 - (long)pNVar9 >> 4));
    if (labelType.id != 0) {
      receivedType_00 = ScopeCtx::getResultType(scope);
      trampolineLabel_00.super_IString.str._M_str = (char *)TVar2.id;
      trampolineLabel_00.super_IString.str._M_len = local_98;
      fixExtraOutput::anon_class_16_2_3efcb345::operator()
                ((anon_class_16_2_3efcb345 *)local_b0,receivedType_00,trampolineLabel_00,label);
    }
  }
  return (Expression *)local_40;
}

Assistant:

Expression*
IRBuilder::fixExtraOutput(ScopeCtx& scope, Name label, Expression* curr) {
  // Add a trampoline branch target. Reuse unnamed blocks.
  auto addTrampoline =
    [&](Type receivedType, Name trampolineLabel, Name skipLabel) {
      if (auto* block = curr->dynCast<Block>(); block && !block->name) {
        block->name = trampolineLabel;
        if (block->list.back()->type == Type::none) {
          block->list.push_back(builder.makeBreak(skipLabel));
        } else {
          block->list.back() = builder.makeBreak(skipLabel, block->list.back());
        }
        block->type = receivedType;
      } else {
        assert(curr->type != Type::none);
        curr = builder.makeBlock(
          trampolineLabel, {builder.makeBreak(skipLabel, curr)}, receivedType);
      }
    };

  auto labelType = scope.getLabelType();
  Name fallthroughLabel;
  for (Index i = 0; i < scope.outputLabels.size(); ++i) {
    auto extraLabel = scope.outputLabels[i];
    if (!extraLabel) {
      continue;
    }

    auto extraLocal = scope.outputLocals[i];
    auto extraType = func->getLocalType(extraLocal);
    Type receivedType =
      Tuple(labelType.begin() + extraType.size(), labelType.end());

    // For normal blocks, the original fallthrough values can be sent to the
    // scope label and they will end up in the right place, but for loops, the
    // fallthrough values should _not_ go to the scope label. We will add a new
    // branch target at the end to send the fallthrough values to.
    if (scope.getLoop() && !fallthroughLabel) {
      fallthroughLabel = makeFresh(label);
      addTrampoline(receivedType, extraLabel, fallthroughLabel);
    } else {
      addTrampoline(receivedType, extraLabel, label);
    }

    // If all the received values are in the scratch local, just fetch them out.
    if (receivedType == Type::none) {
      assert(extraType == labelType);
      curr = builder.makeSequence(
        curr, builder.makeLocalGet(extraLocal, extraType), extraType);
      continue;
    }

    // Otherwise, we have to reorder the received values past the extra values
    // from the scratch local using an additional scratch local.
    auto receivedLocal = *addScratchLocal(receivedType);
    curr = builder.makeLocalSet(receivedLocal, curr);

    // Concatenate the extra values and received values into a tuple.
    std::vector<Expression*> elems;
    if (extraType.isSingle()) {
      elems.push_back(builder.makeLocalGet(extraLocal, extraType));
    } else {
      for (Index j = 0; j < extraType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(extraLocal, extraType), j));
      }
    }
    if (receivedType.isSingle()) {
      elems.push_back(builder.makeLocalGet(receivedLocal, receivedType));
    } else {
      for (Index j = 0; j < receivedType.size(); ++j) {
        elems.push_back(builder.makeTupleExtract(
          builder.makeLocalGet(receivedLocal, receivedType), j));
      }
    }

    curr = builder.makeSequence(curr, builder.makeTupleMake(elems), labelType);
  }

  if (fallthroughLabel) {
    // The loop fallthrough values need to propagate to one final trampoline.
    addTrampoline(scope.getResultType(), fallthroughLabel, label);
  }
  return curr;
}